

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

size_t zt_hexdump(_func_int_void_ptr *_getchar,void *data,zt_hexdump_output output,void *odata)

{
  char *pcVar1;
  undefined1 *puVar2;
  int iVar3;
  ushort **ppuVar4;
  undefined8 in_RCX;
  code *in_RDX;
  undefined8 in_RSI;
  code *in_RDI;
  char _hex [51];
  char _txt [17];
  size_t _addr;
  uint32_t addr;
  int c;
  size_t cpos;
  size_t hpos;
  size_t bytes;
  undefined1 local_ac;
  char local_a8 [64];
  undefined1 local_68 [24];
  ulong local_50;
  uint local_48;
  uint local_44;
  long local_40;
  long local_38;
  size_t local_30;
  undefined8 local_28;
  code *local_20;
  undefined8 local_18;
  code *local_10;
  size_t local_8;
  
  local_30 = 0;
  local_38 = 0;
  local_40 = 0;
  local_44 = 0;
  local_48 = 0;
  local_50 = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RDX == (code *)0x0) {
    local_20 = zt_hexdump_default_printer;
  }
  while( true ) {
    local_44 = (*local_10)(local_18);
    if (local_44 == 0xffffffff) {
      if ((((local_48 & 0xf) == 0xf) || ((local_48 & 0xf) == 0)) ||
         (iVar3 = (*local_20)(local_28,local_50,local_a8,local_68), iVar3 != -1)) {
        (*local_20)(local_28,0,0);
        local_8 = local_30;
      }
      else {
        local_8 = 0xffffffffffffffff;
      }
      return local_8;
    }
    if ((local_48 & 0xf) == 0) {
      local_50 = (ulong)local_48;
      memset(local_68,0,0x11);
      memset(local_a8,0,0x33);
      local_38 = 0;
      local_40 = 0;
    }
    pcVar1 = local_a8 + local_38;
    local_38 = local_38 + 1;
    *pcVar1 = "0123456789abcdef"[(int)((int)local_44 >> 4 & 0xf)];
    pcVar1 = local_a8 + local_38;
    local_38 = local_38 + 1;
    *pcVar1 = "0123456789abcdef"[(int)(local_44 & 0xf)];
    pcVar1 = local_a8 + local_38;
    local_38 = local_38 + 1;
    *pcVar1 = ' ';
    ppuVar4 = __ctype_b_loc();
    if (((*ppuVar4)[(int)local_44] & 0x4000) == 0) {
      local_ac = 0x2e;
    }
    else {
      local_ac = (undefined1)local_44;
    }
    puVar2 = local_68 + local_40;
    local_40 = local_40 + 1;
    *puVar2 = local_ac;
    if (((local_48 & 0xf) == 0xf) && (iVar3 = (*local_20)(local_28,local_50,local_a8), iVar3 == -1))
    break;
    local_48 = local_48 + 1;
    local_30 = local_30 + 1;
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t
zt_hexdump(int _getchar(void *), void * data, zt_hexdump_output output, void * odata) {
    size_t    bytes = 0;
    size_t    hpos = 0, cpos = 0;
    int       c = 0;
    uint32_t  addr = 0L;
    size_t    _addr = 0L;
    char      _txt[16+1];
    char      _hex[(16*3)+3];

    if (output == NULL) {
        output = zt_hexdump_default_printer;
    }

    while ((c = _getchar(data)) != EOF) {

        if (addr % 16 == 0) {
            _addr = addr;
            memset(_txt, 0, sizeof(_txt));
            memset(_hex, 0, sizeof(_hex));
            hpos = 0;
            cpos = 0;
        }

        *(_hex+hpos++) = HEX_DIGITS[((c >> 4) & 0xF)];
        *(_hex+hpos++) = HEX_DIGITS[(c  & 0xF)];
        *(_hex+hpos++) = ' ';

        *(_txt+cpos++) = isprint(c) ? c : '.';

        if (addr % 16 == 15) {
            if (output(odata, _addr, _hex, _txt) == -1) {
                return -1;
            }
        }
        addr++;
        bytes++;
    }

    if ((addr % 16 != 15) && (addr % 16 != 0)) {
        if (output(odata, _addr, _hex, _txt) == -1 ) {
            return -1;
        }
    }

    output(odata, 0, NULL, NULL);
    return bytes;
}